

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int attlist2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  ulong uVar5;
  bool bVar6;
  
  iVar2 = 0x21;
  if (tok == 0xf) {
    return 0x21;
  }
  if (tok == 0x17) {
    pcVar4 = attlist3;
  }
  else {
    if (tok == 0x12) {
      iVar2 = (*enc->nameMatchesAscii)(enc,ptr,end,"CDATA");
      if (iVar2 == 0) {
        uVar1 = 0;
        do {
          uVar5 = uVar1;
          bVar6 = 6 < uVar5;
          if (uVar5 == 7) {
            iVar2 = 7;
            goto LAB_001782e3;
          }
          iVar2 = (*enc->nameMatchesAscii)
                            (enc,ptr,end,
                             attlist2_types_rel + *(int *)(attlist2_types_rel + uVar5 * 4 + 4));
          uVar1 = uVar5 + 1;
        } while (iVar2 == 0);
        bVar6 = 6 < uVar5;
        iVar2 = (int)(uVar5 + 1) + 0x17;
      }
      else {
        iVar2 = 0x17;
        bVar6 = false;
      }
      state->handler = attlist8;
LAB_001782e3:
      if (!bVar6) {
        return iVar2;
      }
      iVar3 = (*enc->nameMatchesAscii)(enc,ptr,end,"NOTATION");
      iVar2 = 0x21;
      if (iVar3 != 0) {
        pcVar4 = attlist5;
        goto LAB_0017832a;
      }
    }
    iVar2 = -1;
    pcVar4 = error;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x3b;
    }
  }
LAB_0017832a:
  state->handler = pcVar4;
  return iVar2;
}

Assistant:

static int PTRCALL
attlist2(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NAME: {
    static const char *const types[] = {
        KW_CDATA,  KW_ID,       KW_IDREF,   KW_IDREFS,
        KW_ENTITY, KW_ENTITIES, KW_NMTOKEN, KW_NMTOKENS,
    };
    int i;
    for (i = 0; i < (int)(sizeof(types) / sizeof(types[0])); i++)
      if (XmlNameMatchesAscii(enc, ptr, end, types[i])) {
        state->handler = attlist8;
        return XML_ROLE_ATTRIBUTE_TYPE_CDATA + i;
      }
  }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_NOTATION)) {
      state->handler = attlist5;
      return XML_ROLE_ATTLIST_NONE;
    }
    break;
  case XML_TOK_OPEN_PAREN:
    state->handler = attlist3;
    return XML_ROLE_ATTLIST_NONE;
  }
  return common(state, tok);
}